

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O2

uintmax_t __thiscall
pstack::Procman::ExpressionStack::eval
          (ExpressionStack *this,Process *proc,Attribute *attr,StackFrame *frame,Addr reloc)

{
  int iVar1;
  Reader *pRVar2;
  Off OVar3;
  string *psVar4;
  DW_LLE lle;
  ulong uVar5;
  Block *pBVar6;
  intmax_t iVar7;
  intmax_t iVar8;
  uintmax_t uVar9;
  Exception *pEVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Addr AVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 local_318 [8];
  Attribute unitLow;
  DIE local_2e8;
  undefined1 local_2c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> local_2b0;
  uint local_2a0;
  undefined8 local_120;
  element_type *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  __shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> local_f8;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  __shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> local_d8;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  undefined1 local_b0 [8];
  ProcessLocation loc;
  sptr unit;
  unsigned_long local_70;
  uint64_t base;
  DWARFReader local_60;
  uintmax_t local_38;
  
  base = (uint64_t)this;
  local_38 = reloc;
  std::__shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2> *)
             &loc.codeloc.
              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2> *)(attr + 0x18));
  lVar12 = *(long *)&loc.codeloc.
                     super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi[0xc]._M_use_count;
  StackFrame::scopeIP((ProcessLocation *)local_b0,frame,proc);
  unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
  pstack::Dwarf::Unit::root();
  pstack::Dwarf::DIE::attribute((AttrName)local_318,SUB81(&local_2e8,0));
  uVar5 = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_318);
  local_70 = uVar5 + local_38;
  iVar1 = **(int **)(attr + 0x28);
  if (1 < iVar1 - 9U) {
    if (iVar1 == 0x17) {
      psVar4 = *(string **)(lVar12 + 0x10);
      if (4 < *(ushort *)
               &loc.codeloc.
                super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[0xf]._vptr__Sp_counted_base) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2c0,".debug_loclists",(allocator<char> *)&local_60);
        pstack::Elf::Object::getDebugSection(psVar4,(uint)local_2c0);
        std::__cxx11::string::~string((string *)local_2c0);
        psVar4 = *(string **)(lVar12 + 0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2c0,".debug_addr",(allocator<char> *)&local_60);
        local_120 = pstack::Elf::Object::getDebugSection(psVar4,(uint)local_2c0);
        std::__cxx11::string::~string((string *)local_2c0);
        pstack::Elf::Section::io();
        local_60.off = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
        local_60.end = (**(code **)(*(long *)local_118 + 0x40))();
        local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_118;
        local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = _Stack_110._M_pi;
        local_118 = (element_type *)0x0;
        _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_60.addrLen = 8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_110);
LAB_0013e474:
        lle = Dwarf::DWARFReader::getu8(&local_60);
        switch(lle) {
        case DW_LLE_end_of_list:
          goto switchD_0013e490_caseD_0;
        case DW_LLE_base_addressx:
          auVar13 = (**(code **)(*(long *)local_60.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_60.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_60.off);
          local_60.off = local_60.off + auVar13._8_8_;
          pstack::Elf::Section::io();
          Reader::readObj<unsigned_long>
                    ((Reader *)local_2c0,
                     auVar13._0_8_ *
                     (ulong)*(byte *)&loc.codeloc.
                                      super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi[0x10]._vptr__Sp_counted_base,&local_70,1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8);
          goto LAB_0013e474;
        default:
          pEVar10 = (Exception *)__cxa_allocate_exception(0x1a0);
          memset((Exception *)local_2c0,0,0x1a0);
          Exception::Exception((Exception *)local_2c0);
          std::operator<<((ostream *)&local_2b8,"unhandled DW_LLE_");
          Procman::operator<<((ostream *)&local_2b8,lle);
          Exception::Exception(pEVar10,(Exception *)local_2c0);
          __cxa_throw(pEVar10,&Exception::typeinfo,Exception::~Exception);
        case DW_LLE_offset_pair:
          auVar13 = (**(code **)(*(long *)local_60.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_60.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_60.off);
          local_60.off = local_60.off + auVar13._8_8_;
          auVar14 = (**(code **)(*(long *)local_60.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_60.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_60.off);
          local_60.off = local_60.off + auVar14._8_8_;
          auVar15 = (**(code **)(*(long *)local_60.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))();
          lVar12 = auVar15._0_8_;
          local_60.off = local_60.off + auVar15._8_8_;
          if ((unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auVar13._0_8_ + local_70))
             || ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_70 + auVar14._0_8_) <=
                 unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)) {
LAB_0013e5bf:
            local_60.off = local_60.off + lVar12;
            goto LAB_0013e474;
          }
          std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_108,
                     &local_60.io.
                      super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>);
          local_2b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60.off + lVar12);
          local_2c0 = (undefined1  [8])local_60.off;
          if (local_2b8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff)
          {
            local_2b8._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (**(code **)(*(long *)local_108._M_ptr + 0x40))();
          }
          local_2b0._M_ptr = local_108._M_ptr;
          local_2b0._M_refcount._M_pi = local_108._M_refcount._M_pi;
          local_108._M_ptr = (element_type *)0x0;
          local_108._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2a0 = 8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
          if (loc.location_ == 0) {
            AVar11 = 0;
          }
          else {
            AVar11 = (long)local_b0 - *(long *)loc.location_;
          }
          local_38 = eval((ExpressionStack *)base,proc,(DWARFReader *)local_2c0,frame,AVar11);
          break;
        case DW_LLE_base_address:
          goto switchD_0013e490_caseD_6;
        case DW_LLE_start_length:
          uVar9 = Dwarf::DWARFReader::getuint
                            (&local_60,
                             (ulong)*(byte *)&loc.codeloc.
                                              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi[0x10]._vptr__Sp_counted_base);
          auVar13 = (**(code **)(*(long *)local_60.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))
                              (local_60.io.
                               super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,local_60.off);
          local_60.off = local_60.off + auVar13._8_8_;
          auVar14 = (**(code **)(*(long *)local_60.io.
                                          super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x18))();
          lVar12 = auVar14._0_8_;
          local_60.off = local_60.off + auVar14._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar9 + local_70))->
                      _vptr__Sp_counted_base + auVar13._0_8_) <=
              unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi || unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi <
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar9 + local_70))
          goto LAB_0013e5bf;
          std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_f8,
                     &local_60.io.
                      super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>);
          local_2b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60.off + lVar12);
          local_2c0 = (undefined1  [8])local_60.off;
          if (local_2b8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff)
          {
            local_2b8._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (**(code **)(*(long *)local_f8._M_ptr + 0x40))();
          }
          local_2b0._M_ptr = local_f8._M_ptr;
          local_2b0._M_refcount._M_pi = local_f8._M_refcount._M_pi;
          local_f8._M_ptr = (element_type *)0x0;
          local_f8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2a0 = 8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
          if (loc.location_ == 0) {
            AVar11 = 0;
          }
          else {
            AVar11 = (long)local_b0 - *(long *)loc.location_;
          }
          local_38 = eval((ExpressionStack *)base,proc,(DWARFReader *)local_2c0,frame,AVar11);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0._M_refcount);
        goto LAB_0013e913;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2c0,".debug_loc",(allocator<char> *)&local_60);
      pstack::Elf::Object::getDebugSection(psVar4,(uint)local_2c0);
      std::__cxx11::string::~string((string *)local_2c0);
      pstack::Elf::Section::io();
      local_2c0 = (undefined1  [8])
                  pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
      local_2b8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(**(code **)(*(long *)local_e8 + 0x40))()
      ;
      local_2b0._M_ptr = local_e8;
      local_2b0._M_refcount._M_pi = _Stack_e0._M_pi;
      local_e8 = (element_type *)0x0;
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2a0 = 8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
      local_38 = 0;
      while( true ) {
        iVar7 = Dwarf::DWARFReader::getint((DWARFReader *)local_2c0,8);
        iVar8 = Dwarf::DWARFReader::getint((DWARFReader *)local_2c0,8);
        if (iVar8 == 0 && iVar7 == 0) break;
        uVar9 = Dwarf::DWARFReader::getuint((DWARFReader *)local_2c0,2);
        if (unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iVar8 + local_70) &&
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iVar7 + local_70) <=
            unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi) {
          std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_d8,&local_2b0);
          local_60.end = (long)local_2c0 + (uVar9 & 0xffffffff);
          local_60.off = (Off)local_2c0;
          if ((Reader *)local_60.end == (Reader *)0xffffffffffffffff) {
            local_60.end = (**(code **)(*(long *)local_d8._M_ptr + 0x40))();
          }
          local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8._M_ptr;
          local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_d8._M_refcount._M_pi;
          local_d8._M_ptr = (element_type *)0x0;
          local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_60.addrLen = 8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
          if (loc.location_ == 0) {
            AVar11 = 0;
          }
          else {
            AVar11 = (long)local_b0 - *(long *)loc.location_;
          }
          local_38 = eval((ExpressionStack *)base,proc,&local_60,frame,AVar11);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_60.io.
                      super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          break;
        }
        local_2c0 = (undefined1  [8])((long)local_2c0 + uVar9);
      }
      this_00 = &local_2b0._M_refcount;
      goto LAB_0013e331;
    }
    if (iVar1 != 0x18) {
      pEVar10 = (Exception *)__cxa_allocate_exception(0x1a0);
      memset((Exception *)local_2c0,0,0x1a0);
      Exception::Exception((Exception *)local_2c0);
      std::operator<<((ostream *)&local_2b8,"unhandled attribute form ");
      std::ostream::operator<<((ostream *)&local_2b8,**(int **)(attr + 0x28));
      std::operator<<((ostream *)&local_2b8," evaluating expression");
      Exception::Exception(pEVar10,(Exception *)local_2c0);
      __cxa_throw(pEVar10,&Exception::typeinfo,Exception::~Exception);
    }
  }
  pBVar6 = Dwarf::DIE::Attribute::operator_cast_to_Block_(attr);
  pRVar2 = (Reader *)pBVar6->offset;
  OVar3 = pBVar6->length;
  pstack::Elf::Section::io();
  local_2b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pRVar2 + OVar3);
  local_2c0 = (undefined1  [8])pRVar2;
  if (local_2b8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
    local_2b8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(**(code **)(*(long *)local_c8 + 0x40))();
  }
  this_00 = &local_2b0._M_refcount;
  local_2b0._M_ptr = local_c8;
  local_2b0._M_refcount._M_pi = a_Stack_c0[0]._M_pi;
  local_c8 = (element_type *)0x0;
  a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2a0 = 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_c0);
  local_38 = eval((ExpressionStack *)base,proc,(DWARFReader *)local_2c0,frame,local_38);
  goto LAB_0013e331;
switchD_0013e490_caseD_6:
  uVar9 = Dwarf::DWARFReader::getuint
                    (&local_60,
                     (ulong)*(byte *)&loc.codeloc.
                                      super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi[0x10]._vptr__Sp_counted_base);
  local_70 = uVar9 + local_38;
  goto LAB_0013e474;
switchD_0013e490_caseD_0:
  local_38 = 0;
LAB_0013e913:
  this_00 = &local_60.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
LAB_0013e331:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  Dwarf::DIE::~DIE((DIE *)local_318);
  Dwarf::DIE::~DIE(&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&loc.codeloc);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&unit);
  return local_38;
}

Assistant:

uintmax_t
ExpressionStack::eval(Process &proc, const Dwarf::DIE::Attribute &attr,
                      const StackFrame *frame, Elf::Addr reloc)
{
    Dwarf::Unit::sptr unit = attr.die.getUnit();
    const Dwarf::Info *dwarf = unit->dwarf;
    auto loc = frame->scopeIP(proc);
    auto ip = loc.location();

    const auto &unitEntry = unit->root();
    auto unitLow = unitEntry.attribute(Dwarf::DW_AT_low_pc);

    // default base address is relocation of the object + base of unit.
    uint64_t base = reloc + uintmax_t(unitLow);

    switch (attr.form()) {
        case Dwarf::DW_FORM_sec_offset:
            if (unit->version >= 5) {
                // For dwarf 5, this will be a debug_loclists entry.
                const Elf::Section &sec = dwarf->elf->getDebugSection(".debug_loclists", SHT_NULL);
                const Elf::Section &addrsec = dwarf->elf->getDebugSection(".debug_addr", SHT_NULL);
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    auto lle = DW_LLE(r.getu8());
                    switch (lle) {
                        case DW_LLE_end_of_list:
                            return 0; // failed to find a loclist for the given IP.

                        case DW_LLE_offset_pair:
                        {
                            auto start = r.getuleb128();
                            auto end = r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }

                        case DW_LLE_base_address:
                            base = reloc + r.getuint(unit->addrlen);
                            break;

                        case DW_LLE_base_addressx:
                            {
                            auto idx = r.getuleb128();
                            addrsec.io()->readObj(idx * unit->addrlen, &base);
                            }
                            break;

                        case DW_LLE_start_length: {
                            auto start = r.getuint(unit->addrlen);
                            auto end = start + r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }
                        default:
                            throw (Exception() << "unhandled DW_LLE_" << lle);
                    }
                }
            } else {
                // For dwarf 4, this will be a debug_loc entry.
                auto &sec = dwarf->elf->getDebugSection(".debug_loc", SHT_NULL);

                // convert this object-relative addr to a unit-relative one
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    Elf::Addr start = r.getint(sizeof start);
                    Elf::Addr end = r.getint(sizeof end);
                    if (start == 0 && end == 0)
                        return 0;
                    auto len = r.getuint(2);
                    if (ip >= base + start && ip < base + end) {
                        Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + Elf::Word(len));
                        return eval(proc, exr, frame, loc.elfReloc());
                    }
                    r.skip(len);
                }
            }
            throw (Exception() << ".debug_loc search failed");

        case Dwarf::DW_FORM_block1:
        case Dwarf::DW_FORM_block:
        case Dwarf::DW_FORM_exprloc: {
            const auto &block = Dwarf::Block(attr);
            Dwarf::DWARFReader r(dwarf->debugInfo.io(), block.offset, block.offset + block.length);
            return eval(proc, r, frame, reloc);
        }
        default:
            throw (Exception() << "unhandled attribute form " << attr.form() << " evaluating expression");
    }
}